

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  size_type *psVar1;
  Signal *this;
  Signal *this_00;
  initializer_list<VcdGen::Signal_*> __l;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_00;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_01;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_02;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_03;
  tuple<unsigned_long,_unsigned_int> local_3d8;
  Signal *local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  undefined8 local_3a0;
  undefined1 local_398 [8];
  Signal data;
  Signal valid;
  Signal wr_en;
  Signal dummy;
  VcdGenerator gen;
  long local_228;
  pointer local_220 [2];
  undefined1 local_210 [8];
  Module Logic;
  Module SubMod;
  Module *local_160 [2];
  string local_150;
  string local_130;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_b0;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_98;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_80;
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_68;
  vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_> local_50;
  allocator_type local_31;
  
  gen.vcd_data_.field_2._8_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&gen.vcd_data_.field_2 + 8),"test_001.vcd","");
  dummy.encoded_name_.field_2._8_8_ = &gen.filename_._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&dummy.encoded_name_.field_2 + 8),gen.vcd_data_.field_2._8_8_,
             local_228 + gen.vcd_data_.field_2._8_8_);
  psVar1 = &gen.vcd_data_._M_string_length;
  gen.vcd_data_._M_dataplus._M_p = (pointer)0x0;
  gen.vcd_data_._M_string_length._0_1_ = 0;
  gen.top_level_module_ = (Module *)psVar1;
  if ((pointer *)gen.vcd_data_.field_2._8_8_ != local_220) {
    operator_delete((void *)gen.vcd_data_.field_2._8_8_,(long)local_220[0] + 1);
  }
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Logic","");
  local_210 = (undefined1  [8])&Logic.name_._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)local_210,local_f0,local_e8 + (long)local_f0);
  Logic.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  Logic.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  Logic.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Logic.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Logic.name_.field_2._8_8_ = 0;
  Logic.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"SubMod","");
  Logic.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)&SubMod.name_._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &Logic.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_d0,local_c8 + (long)local_d0);
  SubMod.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  SubMod.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SubMod.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SubMod.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SubMod.name_.field_2._8_8_ = 0;
  SubMod.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  VcdGen::Module::add_submodule
            ((Module *)local_210,
             (Module *)
             &Logic.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  gen.filename_.field_2._8_8_ = (Module *)local_210;
  SubMod.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &SubMod.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"data","");
  VcdGen::Signal::Signal
            ((Signal *)local_398,
             (string *)
             &SubMod.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8);
  if (SubMod.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != local_160) {
    operator_delete(SubMod.sub_modules_.
                    super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (ulong)((long)&(local_160[0]->name_)._M_dataplus._M_p + 1));
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"valid","");
  this = (Signal *)((long)&data.encoded_name_.field_2 + 8);
  VcdGen::Signal::Signal(this,&local_150,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"wr_en","");
  this_00 = (Signal *)(&valid.encoded_name_.field_2._M_allocated_capacity + 1);
  VcdGen::Signal::Signal(this_00,&local_130,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"dummy","");
  VcdGen::Signal::Signal((Signal *)((long)&wr_en.encoded_name_.field_2 + 8),&local_110,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  __l._M_len = 3;
  __l._M_array = (iterator)&local_3d8;
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ = (Signal *)local_398;
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = (unsigned_long)this;
  local_3c8 = this_00;
  std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>::vector(&local_50,__l,&local_31);
  std::vector<VcdGen::Signal*,std::allocator<VcdGen::Signal*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<VcdGen::Signal**,std::vector<VcdGen::Signal*,std::allocator<VcdGen::Signal*>>>>
            ((vector<VcdGen::Signal*,std::allocator<VcdGen::Signal*>> *)
             ((long)&SubMod.name_.field_2 + 8),
             SubMod.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_50.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_50.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if (local_50.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  VcdGen::Module::add_signal((Module *)local_210,(Signal *)((long)&wr_en.encoded_name_.field_2 + 8))
  ;
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ =
       local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ & 0xffffffff00000000;
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  local_3c8 = (Signal *)CONCAT44(local_3c8._4_4_,0x55);
  local_3c0 = 100;
  local_3b8 = 0;
  local_3b0 = 0x6e;
  local_3a8 = 0;
  local_3a0 = 0x96;
  __l_00._M_len = 4;
  __l_00._M_array = &local_3d8;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_b0,__l_00,(allocator_type *)&local_31);
  VcdGen::Signal::value_at((Signal *)local_398,&local_b0);
  if (local_b0.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ =
       local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ & 0xffffffff00000000;
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  local_3c8 = (Signal *)CONCAT44(local_3c8._4_4_,1);
  local_3c0 = 100;
  local_3b8 = 0;
  local_3b0 = 0x6e;
  local_3a8 = 0;
  local_3a0 = 0x96;
  __l_01._M_len = 4;
  __l_01._M_array = &local_3d8;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_98,__l_01,(allocator_type *)&local_31);
  VcdGen::Signal::value_at((Signal *)((long)&data.encoded_name_.field_2 + 8),&local_98);
  if (local_98.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ =
       local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ & 0xffffffff00000000;
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  local_3c8 = (Signal *)CONCAT44(local_3c8._4_4_,1);
  local_3c0 = 100;
  local_3b8 = 0;
  local_3b0 = 0x6e;
  local_3a8 = 0;
  local_3a0 = 0x96;
  __l_02._M_len = 4;
  __l_02._M_array = &local_3d8;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_80,__l_02,(allocator_type *)&local_31);
  VcdGen::Signal::value_at((Signal *)((long)&valid.encoded_name_.field_2 + 8),&local_80);
  if (local_80.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ =
       local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>._0_8_ & 0xffffffff00000000;
  local_3d8.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  local_3c8 = (Signal *)CONCAT44(local_3c8._4_4_,0xb);
  local_3c0 = 100;
  local_3b8 = 0;
  local_3b0 = 0x6e;
  local_3a8 = 0;
  local_3a0 = 0x96;
  __l_03._M_len = 4;
  __l_03._M_array = &local_3d8;
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector(&local_68,__l_03,(allocator_type *)&local_31);
  VcdGen::Signal::value_at((Signal *)((long)&wr_en.encoded_name_.field_2 + 8),&local_68);
  if (local_68.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  VcdGen::VcdGenerator::operator()((VcdGenerator *)((long)&dummy.encoded_name_.field_2 + 8));
  if ((size_type *)dummy._32_8_ != &dummy.encoded_name_._M_string_length) {
    operator_delete((void *)dummy._32_8_,dummy.encoded_name_._M_string_length + 1);
  }
  if ((size_type *)wr_en.encoded_name_.field_2._8_8_ != &dummy.name_._M_string_length) {
    operator_delete((void *)wr_en.encoded_name_.field_2._8_8_,dummy.name_._M_string_length + 1);
  }
  if ((size_type *)wr_en._32_8_ != &wr_en.encoded_name_._M_string_length) {
    operator_delete((void *)wr_en._32_8_,wr_en.encoded_name_._M_string_length + 1);
  }
  if ((size_type *)valid.encoded_name_.field_2._8_8_ != &wr_en.name_._M_string_length) {
    operator_delete((void *)valid.encoded_name_.field_2._8_8_,wr_en.name_._M_string_length + 1);
  }
  if ((size_type *)valid._32_8_ != &valid.encoded_name_._M_string_length) {
    operator_delete((void *)valid._32_8_,valid.encoded_name_._M_string_length + 1);
  }
  if ((size_type *)data.encoded_name_.field_2._8_8_ != &valid.name_._M_string_length) {
    operator_delete((void *)data.encoded_name_.field_2._8_8_,valid.name_._M_string_length + 1);
  }
  if ((size_type *)data._32_8_ != &data.encoded_name_._M_string_length) {
    operator_delete((void *)data._32_8_,data.encoded_name_._M_string_length + 1);
  }
  if (local_398 != (undefined1  [8])&data.name_._M_string_length) {
    operator_delete((void *)local_398,data.name_._M_string_length + 1);
  }
  if (SubMod.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(SubMod.signals_.
                    super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)SubMod.sub_modules_.
                          super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)SubMod.signals_.
                          super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (SubMod.name_.field_2._8_8_ != 0) {
    operator_delete((void *)SubMod.name_.field_2._8_8_,
                    (long)SubMod.signals_.
                          super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - SubMod.name_.field_2._8_8_);
  }
  if (Logic.sub_modules_.super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&SubMod.name_._M_string_length)
  {
    operator_delete(Logic.sub_modules_.
                    super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,SubMod.name_._M_string_length + 1);
  }
  if (Logic.signals_.super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(Logic.signals_.
                    super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)Logic.sub_modules_.
                          super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)Logic.signals_.
                          super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (Logic.name_.field_2._8_8_ != 0) {
    operator_delete((void *)Logic.name_.field_2._8_8_,
                    (long)Logic.signals_.
                          super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - Logic.name_.field_2._8_8_);
  }
  if (local_210 != (undefined1  [8])&Logic.name_._M_string_length) {
    operator_delete((void *)local_210,Logic.name_._M_string_length + 1);
  }
  if (gen.top_level_module_ != (Module *)psVar1) {
    operator_delete(gen.top_level_module_,
                    CONCAT71(gen.vcd_data_._M_string_length._1_7_,
                             (undefined1)gen.vcd_data_._M_string_length) + 1);
  }
  if ((size_type *)dummy.encoded_name_.field_2._8_8_ != &gen.filename_._M_string_length) {
    operator_delete((void *)dummy.encoded_name_.field_2._8_8_,gen.filename_._M_string_length + 1);
  }
  return 0;
}

Assistant:

int main()
{

    // Single instance which generates the VCD
    VcdGen::VcdGenerator gen("test_001.vcd");

    // Hierachy contains modules
    VcdGen::Module Logic {"Logic"};
    VcdGen::Module SubMod {"SubMod"};

    // Modules can be heirarchical
    Logic.add_submodule( &SubMod ) ;

    // Connect things up
    gen.set_top_level_module( &Logic );
    
    // Create Signals : format Signal var{Name, Width};
    VcdGen::Signal data  { "data"  , 8  };
    VcdGen::Signal valid { "valid" , 1  };
    VcdGen::Signal wr_en { "wr_en" , 1  };
    VcdGen::Signal dummy { "dummy" , 16 };

    // Add Signals to the module / submodule
    SubMod.add_signal( {&data, &valid, &wr_en} );
    Logic.add_signal( &dummy );

    // Set values for the signals
    data.value_at(  {{0, 0}, {100, 85}, {110, 0}, {150, 0}} );
    valid.value_at( {{0, 0}, {100, 1} , {110, 0}, {150, 0}} );
    wr_en.value_at( {{0, 0}, {100, 1} , {110, 0}, {150, 0}} );
    dummy.value_at( {{0, 0}, {100, 11}, {110, 0}, {150, 0}} );
    
    gen();
}